

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::PackSnorm4x8Case::PackSnorm4x8Case
          (PackSnorm4x8Case *this,Context *context,ShaderType shaderType,Precision precision)

{
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Symbol local_58;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"packsnorm4x8",&local_99);
  std::operator+(&local_78,&local_98,
                 *(char **)(getPrecisionPostfix(glu::Precision)::s_postfix + (ulong)precision * 8));
  std::operator+(&local_58.name,&local_78,
                 *(char **)(getShaderTypePostfix(glu::ShaderType)::s_postfix + (ulong)shaderType * 8
                           ));
  ShaderPackingFunctionCase::ShaderPackingFunctionCase
            (&this->super_ShaderPackingFunctionCase,context,local_58.name._M_dataplus._M_p,
             "packSnorm4x8",shaderType);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  (this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderPackingFunctionCase_00a0eff0;
  this->m_precision = precision;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"in0",&local_99);
  glu::VarType::VarType((VarType *)&local_98,TYPE_FLOAT_VEC4,precision);
  gls::ShaderExecUtil::Symbol::Symbol(&local_58,&local_78,(VarType *)&local_98);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.inputs,&local_58);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_58);
  glu::VarType::~VarType((VarType *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"out0",&local_99);
  glu::VarType::VarType((VarType *)&local_98,TYPE_UINT,PRECISION_HIGHP);
  gls::ShaderExecUtil::Symbol::Symbol(&local_58,&local_78,(VarType *)&local_98);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_ShaderPackingFunctionCase).m_spec.outputs,&local_58);
  gls::ShaderExecUtil::Symbol::~Symbol(&local_58);
  glu::VarType::~VarType((VarType *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::assign((char *)&(this->super_ShaderPackingFunctionCase).m_spec.source);
  return;
}

Assistant:

PackSnorm4x8Case (Context& context, glu::ShaderType shaderType, glu::Precision precision)
		: ShaderPackingFunctionCase	(context, (string("packsnorm4x8") + getPrecisionPostfix(precision) + getShaderTypePostfix(shaderType)).c_str(), "packSnorm4x8", shaderType)
		, m_precision				(precision)
	{
		m_spec.inputs.push_back(Symbol("in0", glu::VarType(glu::TYPE_FLOAT_VEC4, precision)));
		m_spec.outputs.push_back(Symbol("out0", glu::VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP)));

		m_spec.source = "out0 = packSnorm4x8(in0);";
	}